

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Asyncify.cpp
# Opt level: O1

Name __thiscall
wasm::Asyncify::createSecondaryMemory(Asyncify *this,Module *module,Address secondaryMemorySize)

{
  bool in_CL;
  string_view root;
  IString IVar1;
  __uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_> local_38;
  unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_> secondaryMemory;
  
  root = IString::interned((IString *)0xf,(string_view)ZEXT816(0xde314d),in_CL);
  IVar1.str = (string_view)Names::getValidMemoryName(module,root);
  local_38._M_t.super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
  super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl =
       (tuple<wasm::Memory_*,_std::default_delete<wasm::Memory>_>)operator_new(0x58);
  (((IString *)
   ((long)local_38._M_t.super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
          super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl + 0x40))->str)._M_len = 0;
  *(char **)((long)local_38._M_t.
                   super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
                   super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl + 0x48) = (char *)0x0;
  *(undefined8 *)
   local_38._M_t.super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
   super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl = 0;
  *(char **)((long)local_38._M_t.
                   super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
                   super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl + 8) = (char *)0x0;
  (((IString *)
   ((long)local_38._M_t.super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
          super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl + 0x10))->str)._M_len = 0;
  *(char **)((long)local_38._M_t.
                   super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
                   super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl + 0x18) = (char *)0x0;
  (((IString *)
   ((long)local_38._M_t.super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
          super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl + 0x20))->str)._M_len = 0;
  *(char **)((long)local_38._M_t.
                   super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
                   super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl + 0x28) = (char *)0x0;
  (((IString *)
   ((long)local_38._M_t.super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
          super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl + 0x30))->str)._M_len = 0;
  *(char **)((long)local_38._M_t.
                   super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
                   super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl + 0x38) = (char *)0x0;
  (((IString *)
   ((long)local_38._M_t.super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
          super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl + 0x40))->str)._M_len = 0x10000;
  *(undefined1 *)
   ((long)local_38._M_t.super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
          super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl + 0x48) = 0;
  (((IString *)
   ((long)local_38._M_t.super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
          super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl + 0x50))->str)._M_len = 2;
  *(string_view *)
   local_38._M_t.super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
   super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl = IVar1.str;
  *(address64_t *)
   ((long)local_38._M_t.super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
          super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl + 0x38) =
       secondaryMemorySize.addr;
  (((IString *)
   ((long)local_38._M_t.super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
          super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl + 0x40))->str)._M_len =
       secondaryMemorySize.addr;
  *(undefined1 *)
   ((long)local_38._M_t.super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
          super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl + 0x48) = 0;
  (((IString *)
   ((long)local_38._M_t.super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
          super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl + 0x50))->str)._M_len = 2;
  Module::addMemory(module,(unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_> *)&local_38
                   );
  if ((_Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>)
      local_38._M_t.super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
      super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl != (Memory *)0x0) {
    operator_delete((void *)local_38._M_t.
                            super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>
                            .super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl,0x58);
  }
  return (IString)(IString)IVar1.str;
}

Assistant:

Name createSecondaryMemory(Module* module, Address secondaryMemorySize) {
    Name name = Names::getValidMemoryName(*module, "asyncify_memory");
    auto secondaryMemory =
      Builder::makeMemory(name, secondaryMemorySize, secondaryMemorySize);
    module->addMemory(std::move(secondaryMemory));
    return name;
  }